

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex_art.hpp
# Opt level: O2

size_t __thiscall
unodb::
mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
::get_current_memory_use
          (mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
           *this)

{
  size_t sVar1;
  
  std::mutex::lock(&this->mutex);
  sVar1 = (this->db_).current_memory_use;
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
  return sVar1;
}

Assistant:

[[nodiscard]] auto get_current_memory_use() const {
    const std::lock_guard guard{mutex};
    return db_.get_current_memory_use();
  }